

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

void * t_pool_worker(void *arg)

{
  int iVar1;
  int *piVar2;
  t_pool_job *j_00;
  t_pool_job *ptVar3;
  void *data;
  bool bVar4;
  int local_2c;
  int i;
  t_pool_job *j;
  t_pool *p;
  t_pool_worker_t *w;
  void *arg_local;
  
  piVar2 = *arg;
  do {
    pthread_mutex_lock((pthread_mutex_t *)(piVar2 + 0xc));
    while( true ) {
      bVar4 = false;
      if (*(long *)(piVar2 + 4) == 0) {
        bVar4 = piVar2[3] == 0;
      }
      if (!bVar4) break;
      piVar2[2] = piVar2[2] + 1;
      if (piVar2[1] == 0) {
        pthread_cond_signal((pthread_cond_t *)(piVar2 + 0x16));
      }
      if ((piVar2[0x3c] == -1) || (*(int *)((long)arg + 8) < piVar2[0x3c])) {
        piVar2[0x3c] = *(int *)((long)arg + 8);
      }
      *(undefined4 *)(*(long *)(piVar2 + 0x3a) + (long)*(int *)((long)arg + 8) * 4) = 1;
      pthread_cond_wait((pthread_cond_t *)((long)arg + 0x18),(pthread_mutex_t *)(piVar2 + 0xc));
      *(undefined4 *)(*(long *)(piVar2 + 0x3a) + (long)*(int *)((long)arg + 8) * 4) = 0;
      piVar2[0x3c] = -1;
      for (local_2c = 0; local_2c < piVar2[8]; local_2c = local_2c + 1) {
        if (*(int *)(*(long *)(piVar2 + 0x3a) + (long)local_2c * 4) != 0) {
          piVar2[0x3c] = local_2c;
          break;
        }
      }
      piVar2[2] = piVar2[2] + -1;
    }
    if (piVar2[3] != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)(piVar2 + 0xc));
      pthread_exit((void *)0x0);
    }
    j_00 = *(t_pool_job **)(piVar2 + 4);
    ptVar3 = j_00->next;
    *(t_pool_job **)(piVar2 + 4) = ptVar3;
    if (ptVar3 == (t_pool_job *)0x0) {
      piVar2[6] = 0;
      piVar2[7] = 0;
    }
    iVar1 = piVar2[1];
    piVar2[1] = iVar1 + -1;
    if (*piVar2 <= iVar1) {
      pthread_cond_signal((pthread_cond_t *)(piVar2 + 0x2e));
    }
    if (piVar2[1] == 0) {
      pthread_cond_signal((pthread_cond_t *)(piVar2 + 0x16));
    }
    pthread_mutex_unlock((pthread_mutex_t *)(piVar2 + 0xc));
    data = (*j_00->func)(j_00->arg);
    t_pool_add_result(j_00,data);
    memset(j_00,0xbb,0x30);
    free(j_00);
  } while( true );
}

Assistant:

static void *t_pool_worker(void *arg) {
    t_pool_worker_t *w = (t_pool_worker_t *)arg;
    t_pool *p = w->p;
    t_pool_job *j;
#ifdef DEBUG_TIME
    struct timeval t1, t2, t3;
#endif

    for (;;) {
	// Pop an item off the pool queue
#ifdef DEBUG_TIME
	gettimeofday(&t1, NULL);
#endif

	pthread_mutex_lock(&p->pool_m);

#ifdef DEBUG_TIME
	gettimeofday(&t2, NULL);
	p->wait_time += TDIFF(t2,t1);
	w->wait_time += TDIFF(t2,t1);
#endif

	// If there is something on the job list and a higher priority
	// thread waiting, let it handle this instead.
//	while (p->head && p->t_stack_top != -1 && p->t_stack_top < w->idx) {
//	    pthread_mutex_unlock(&p->pool_m);
//	    pthread_cond_signal(&p->t[p->t_stack_top].pending_c);
//	    pthread_mutex_lock(&p->pool_m);
//	}

	while (!p->head && !p->shutdown) {
	    p->nwaiting++;

	    if (p->njobs == 0)
		pthread_cond_signal(&p->empty_c);
#ifdef DEBUG_TIME
	    gettimeofday(&t2, NULL);
#endif

#ifdef IN_ORDER
	    // Push this thread to the top of the waiting stack
	    if (p->t_stack_top == -1 || p->t_stack_top > w->idx)
		p->t_stack_top = w->idx;

	    p->t_stack[w->idx] = 1;
	    pthread_cond_wait(&w->pending_c, &p->pool_m);
	    p->t_stack[w->idx] = 0;

	    /* Find new t_stack_top */
	    {
		int i;
		p->t_stack_top = -1;
		for (i = 0; i < p->tsize; i++) {
		    if (p->t_stack[i]) {
			p->t_stack_top = i;
			break;
		    }
		}
	    }
#else
	    pthread_cond_wait(&p->pending_c, &p->pool_m);
#endif

#ifdef DEBUG_TIME
	    gettimeofday(&t3, NULL);
	    p->wait_time += TDIFF(t3,t2);
	    w->wait_time += TDIFF(t3,t2);
#endif
	    p->nwaiting--;
	}

	if (p->shutdown) {
#ifdef DEBUG_TIME
	    p->total_time += TDIFF(t3,t1);
#endif
#ifdef DEBUG
	    fprintf(stderr, "%d: Shutting down\n", worker_id(p));
#endif
	    pthread_mutex_unlock(&p->pool_m);
	    pthread_exit(NULL);
	}

	j = p->head;
	if (!(p->head = j->next))
	    p->tail = NULL;

	if (p->njobs-- >= p->qsize)
	    pthread_cond_signal(&p->full_c);

	if (p->njobs == 0)
	    pthread_cond_signal(&p->empty_c);

	pthread_mutex_unlock(&p->pool_m);
	    
	// We have job 'j' - now execute it.
	t_pool_add_result(j, j->func(j->arg));	
#ifdef DEBUG_TIME
	pthread_mutex_lock(&p->pool_m);
	gettimeofday(&t3, NULL);
	p->total_time += TDIFF(t3,t1);
	pthread_mutex_unlock(&p->pool_m);
#endif
	memset(j, 0xbb, sizeof(*j));
	free(j);
    }

    return NULL;
}